

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O0

void ImGuiStb::stb_textedit_delete_selection(ImGuiInputTextState *str,STB_TexteditState *state)

{
  ImGuiID IVar1;
  ImGuiInputTextState *in_RSI;
  STB_TexteditState *in_stack_ffffffffffffffe8;
  
  stb_textedit_clamp(in_RSI,in_stack_ffffffffffffffe8);
  if (*(int *)&in_RSI->field_0x4 != (in_RSI->TextW).Size) {
    if (*(int *)&in_RSI->field_0x4 < (in_RSI->TextW).Size) {
      stb_textedit_delete(in_RSI,in_stack_ffffffffffffffe8,0,0x1933cc);
      in_RSI->ID = *(ImGuiID *)&in_RSI->field_0x4;
      (in_RSI->TextW).Size = *(ImGuiID *)&in_RSI->field_0x4;
    }
    else {
      stb_textedit_delete(in_RSI,in_stack_ffffffffffffffe8,0,0x19340c);
      IVar1 = (in_RSI->TextW).Size;
      in_RSI->ID = IVar1;
      *(ImGuiID *)&in_RSI->field_0x4 = IVar1;
    }
    *(undefined1 *)((long)&(in_RSI->TextW).Capacity + 3) = 0;
  }
  return;
}

Assistant:

static void stb_textedit_delete_selection(STB_TEXTEDIT_STRING *str, STB_TexteditState *state)
{
   stb_textedit_clamp(str, state);
   if (STB_TEXT_HAS_SELECTION(state)) {
      if (state->select_start < state->select_end) {
         stb_textedit_delete(str, state, state->select_start, state->select_end - state->select_start);
         state->select_end = state->cursor = state->select_start;
      } else {
         stb_textedit_delete(str, state, state->select_end, state->select_start - state->select_end);
         state->select_start = state->cursor = state->select_end;
      }
      state->has_preferred_x = 0;
   }
}